

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

void Abc_FrameReplaceCex(Abc_Frame_t *pAbc,Abc_Cex_t **ppCex)

{
  Vec_Ptr_t *__ptr;
  long lVar1;
  
  if (pAbc->pCex != (Abc_Cex_t *)0x0) {
    free(pAbc->pCex);
    pAbc->pCex = (Abc_Cex_t *)0x0;
  }
  pAbc->pCex = *ppCex;
  *ppCex = (Abc_Cex_t *)0x0;
  __ptr = pAbc->vCexVec;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar1]) {
          free(__ptr->pArray[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    pAbc->vCexVec = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCex( Abc_Frame_t * pAbc, Abc_Cex_t ** ppCex )
{
    // update CEX
    ABC_FREE( pAbc->pCex );
    pAbc->pCex = *ppCex;
    *ppCex = NULL;
    // remove CEX vector
    if ( pAbc->vCexVec )
    {
        Vec_PtrFreeFree( pAbc->vCexVec );
        pAbc->vCexVec = NULL;
    }
}